

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewSymbolTreeVisitor.cpp
# Opt level: O2

void __thiscall NewSymbolTreeVisitor::Visit(NewSymbolTreeVisitor *this,FieldAccess *field_access)

{
  symbol_table_t *this_00;
  mapped_type *pmVar1;
  iterator iVar2;
  _Hashtable<Symbol,_std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_01;
  runtime_error *this_02;
  Symbol SStack_a8;
  string local_88;
  Symbol local_68;
  string local_48;
  
  this_00 = &(this->tree_).class_symbols_table_;
  pmVar1 = std::__detail::_Map_base<$a1ab393$>::operator[]
                     ((_Map_base<_a1ab393_> *)this_00,&this->current_layer_->class_symbol_);
  std::__cxx11::string::string((string *)&local_48,(string *)&field_access->field_name_);
  Symbol::Symbol(&SStack_a8,&local_48);
  iVar2 = std::
          _Hashtable<Symbol,_std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<Symbol,_std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)&(pmVar1->
                     super__Tuple_impl<0UL,_std::unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>,_std::unordered_map<Symbol,_std::shared_ptr<Method>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Method>_>_>_>,_std::unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>_>
                     ).
                     super__Head_base<0UL,_std::unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>,_false>
                 ,&SStack_a8);
  std::__detail::_Map_base<$a1ab393$>::operator[]
            ((_Map_base<_a1ab393_> *)this_00,&this->current_layer_->class_symbol_);
  if (iVar2.
      super__Node_iterator_base<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    this_01 = (_Hashtable<Symbol,_std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)std::__detail::_Map_base<$a1ab393$>::operator[]
                           ((_Map_base<_a1ab393_> *)this_00,&this->current_layer_->class_symbol_);
    std::__cxx11::string::string((string *)&local_88,(string *)&field_access->field_name_);
    Symbol::Symbol(&local_68,&local_88);
    iVar2 = std::
            _Hashtable<Symbol,_std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(this_01,&local_68);
    std::__detail::_Map_base<$a1ab393$>::operator[]
              ((_Map_base<_a1ab393_> *)this_00,&this->current_layer_->class_symbol_);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&SStack_a8);
    std::__cxx11::string::~string((string *)&local_48);
    if (iVar2.
        super__Node_iterator_base<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_02,"Invalid field access");
      __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    std::__cxx11::string::~string((string *)&SStack_a8);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return;
}

Assistant:

void NewSymbolTreeVisitor::Visit(FieldAccess* field_access) {
  if (std::get<0>(tree_.class_symbols_table_[current_layer_->class_symbol_])
              .find(Symbol(field_access->field_name_)) ==
          std::get<0>(tree_.class_symbols_table_[current_layer_->class_symbol_])
              .end() &&
      std::get<2>(tree_.class_symbols_table_[current_layer_->class_symbol_])
              .find(Symbol(field_access->field_name_)) ==
          std::get<2>(tree_.class_symbols_table_[current_layer_->class_symbol_])
              .end()) {
    throw std::runtime_error("Invalid field access");
  }
}